

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O1

png_uint_32
png_get_pCAL(png_const_structrp png_ptr,png_inforp info_ptr,png_charp *purpose,png_int_32 *X0,
            png_int_32 *X1,int *type,int *nparams,png_charp *units,png_charpp *params)

{
  png_uint_32 pVar1;
  png_uint_32 pVar2;
  
  pVar1 = 0;
  pVar2 = 0;
  if ((((((info_ptr != (png_inforp)0x0 && png_ptr != (png_const_structrp)0x0) &&
         (pVar2 = 0, params != (png_charpp *)0x0)) && (pVar2 = pVar1, units != (png_charp *)0x0)) &&
       ((nparams != (int *)0x0 && (type != (int *)0x0)))) &&
      ((X1 != (png_int_32 *)0x0 && ((X0 != (png_int_32 *)0x0 && (purpose != (png_charp *)0x0))))))
     && ((info_ptr->valid & 0x400) != 0)) {
    *purpose = info_ptr->pcal_purpose;
    *X0 = info_ptr->pcal_X0;
    *X1 = info_ptr->pcal_X1;
    *type = (uint)info_ptr->pcal_type;
    *nparams = (uint)info_ptr->pcal_nparams;
    *units = info_ptr->pcal_units;
    *params = info_ptr->pcal_params;
    pVar2 = 0x400;
  }
  return pVar2;
}

Assistant:

png_uint_32 PNGAPI
png_get_pCAL(png_const_structrp png_ptr, png_inforp info_ptr,
    png_charp *purpose, png_int_32 *X0, png_int_32 *X1, int *type, int *nparams,
    png_charp *units, png_charpp *params)
{
   png_debug1(1, "in %s retrieval function", "pCAL");

   if (png_ptr != NULL && info_ptr != NULL &&
       (info_ptr->valid & PNG_INFO_pCAL) != 0 &&
       purpose != NULL && X0 != NULL && X1 != NULL && type != NULL &&
       nparams != NULL && units != NULL && params != NULL)
   {
      *purpose = info_ptr->pcal_purpose;
      *X0 = info_ptr->pcal_X0;
      *X1 = info_ptr->pcal_X1;
      *type = (int)info_ptr->pcal_type;
      *nparams = (int)info_ptr->pcal_nparams;
      *units = info_ptr->pcal_units;
      *params = info_ptr->pcal_params;
      return (PNG_INFO_pCAL);
   }

   return (0);
}